

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O3

int Gia_ManComputeOverlapOne(Gia_Man_t *p,int iObj)

{
  Vec_Int_t *pVVar1;
  int *piVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  
  Gia_ManIncrementTravId(p);
  if (-1 < iObj) {
    pVVar1 = p->vMapping;
    uVar5 = pVVar1->nSize;
    if (iObj < (int)uVar5) {
      piVar2 = pVVar1->pArray;
      lVar4 = 0;
      do {
        lVar6 = (long)piVar2[(uint)iObj];
        if ((lVar6 < 0) || (uVar5 <= (uint)piVar2[(uint)iObj])) break;
        if (piVar2[lVar6] <= lVar4) {
          iVar3 = Gia_ManComputeOverlapOne_rec(p,iObj);
          return iVar3;
        }
        if (p->nTravIdsAlloc <= piVar2[lVar6 + lVar4 + 1]) {
          __assert_fail("Id < p->nTravIdsAlloc",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x266,"void Gia_ObjSetTravIdCurrentId(Gia_Man_t *, int)");
        }
        p->pTravIds[piVar2[lVar6 + lVar4 + 1]] = p->nTravIds;
        lVar4 = lVar4 + 1;
        uVar5 = pVVar1->nSize;
      } while (iObj < (int)uVar5);
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Gia_ManComputeOverlapOne( Gia_Man_t * p, int iObj )
{
    int iFan, k;
    Gia_ManIncrementTravId(p);
    Gia_LutForEachFanin( p, iObj, iFan, k )
        Gia_ObjSetTravIdCurrentId( p, iFan );
    return Gia_ManComputeOverlapOne_rec( p, iObj );
}